

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

Aig_Man_t * Saig_ManCreateEquivMiter(Aig_Man_t *pAig,Vec_Int_t *vPairs,int fAddOuts)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *p;
  char *pcVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  
  if (pAig->nConstrs < 1) {
    p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
    pcVar3 = Abc_UtilStrsav(pAig->pName);
    p->pName = pcVar3;
    p->nConstrs = pAig->nConstrs;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    for (iVar8 = 0; iVar8 < pAig->vCis->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar8);
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar8);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        pAVar7 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(p,pAVar6,pAVar7);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
    uVar1 = vPairs->nSize;
    if ((uVar1 & 1) != 0) {
      __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                    ,0x72,"Aig_Man_t *Saig_ManCreateEquivMiter(Aig_Man_t *, Vec_Int_t *, int)");
    }
    for (iVar8 = 0; iVar8 < (int)uVar1; iVar8 = iVar8 + 2) {
      iVar2 = Vec_IntEntry(vPairs,iVar8);
      pAVar5 = Aig_ManObj(pAig,iVar2);
      iVar2 = Vec_IntEntry(vPairs,iVar8 + 1);
      pAVar6 = Aig_ManObj(pAig,iVar2);
      pAVar7 = Aig_Exor(p,(Aig_Obj_t *)(pAVar5->field_5).pData,(Aig_Obj_t *)(pAVar6->field_5).pData)
      ;
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)((*(uint *)&pAVar6->field_0x18 ^ *(uint *)&pAVar5->field_0x18) >> 3
                                & 1) ^ (ulong)pAVar7));
      uVar1 = vPairs->nSize;
    }
    if (fAddOuts == 0) {
      Aig_ManCleanup(p);
    }
    else {
      for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        Aig_ObjCreateCo(p,pAVar5);
      }
      Aig_ManCleanup(p);
      Aig_ManSetRegNum(p,pAig->nRegs);
    }
  }
  else {
    puts("The AIG manager should have no constraints.");
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateEquivMiter( Aig_Man_t * pAig, Vec_Int_t * vPairs, int fAddOuts )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    if ( pAig->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    Aig_ManForEachObjVec( vPairs, pAig, pObj, i )
    {
        pObj2  = Aig_ManObj( pAig, Vec_IntEntry(vPairs, ++i) );
        pMiter = Aig_Exor( pAigNew, (Aig_Obj_t *)pObj->pData, (Aig_Obj_t *)pObj2->pData );
        pMiter = Aig_NotCond( pMiter, pObj->fPhase ^ pObj2->fPhase );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    if ( fAddOuts )
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    if ( fAddOuts )
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}